

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O2

array<ImVec2,_4UL> *
VHMBBCalculate(array<ImVec2,_4UL> *__return_storage_ptr__,
              vector<ImVec2,_std::allocator<ImVec2>_> *hull,double psz)

{
  ImVec2 *pIVar1;
  size_t i_2;
  long lVar2;
  pointer pIVar3;
  size_t i;
  long lVar4;
  pointer pIVar5;
  ulong uVar6;
  size_t x;
  ulong uVar7;
  ImVec2 IVar8;
  double dVar9;
  ImVec2 IVar10;
  ImVec2 v;
  ImVec2 v_00;
  ImVec2 v_01;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double local_c8;
  double local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  
  pIVar3 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar5 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar2 = (long)pIVar5 - (long)pIVar3 >> 3;
  auVar13 = _DAT_001b8350;
  for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
    auVar12._8_8_ = 0;
    auVar12._0_4_ = pIVar3[lVar4].x;
    auVar12._4_4_ = pIVar3[lVar4].y;
    auVar13 = minps(auVar12,auVar13);
  }
  for (lVar4 = 0; lVar2 != lVar4; lVar4 = lVar4 + 1) {
    IVar8.x = pIVar3[lVar4].x - auVar13._0_4_;
    IVar8.y = pIVar3[lVar4].y - auVar13._4_4_;
    pIVar3[lVar4] = IVar8;
  }
  local_c8 = 0.0;
  local_c0 = 1.79769313486232e+308;
  local_58 = 0.0;
  fStack_54 = 0.0;
  uVar7 = 0;
  local_68 = 0.0;
  fStack_64 = 0.0;
  dVar16 = 0.0;
  while (uVar6 = (long)pIVar5 - (long)pIVar3 >> 3, uVar7 < uVar6) {
    pIVar1 = pIVar3 + uVar7;
    uVar7 = uVar7 + 1;
    dVar9 = VHAngleToX(*pIVar1,pIVar3[(ulong)(long)(int)uVar7 % uVar6]);
    uVar6 = 0;
    local_a8._0_4_ = 0xffffffff;
    local_a8._4_4_ = 0x7fefffff;
    local_a8._8_4_ = 0xffffffff;
    local_a8._12_4_ = 0x7fefffff;
    local_b8._0_4_ = (undefined4)DAT_001b8360;
    local_b8._4_4_ = DAT_001b8360._4_4_;
    local_b8._8_8_ = DAT_001b8360._8_8_;
    while( true ) {
      pIVar3 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar5 = (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((ulong)((long)pIVar5 - (long)pIVar3 >> 3) <= uVar6) break;
      IVar10 = VHRotateV(pIVar3[uVar6],-dVar9);
      (hull->super__Vector_base<ImVec2,_std::allocator<ImVec2>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar6] = IVar10;
      auVar14._0_8_ = (double)IVar10.x;
      auVar14._8_8_ = (double)IVar10.y;
      auVar15._8_8_ = auVar14._8_8_;
      auVar15._0_8_ = auVar14._0_8_;
      auVar15 = maxpd(auVar15,local_b8);
      auVar14 = minpd(auVar14,local_a8);
      uVar6 = uVar6 + 1;
      local_a8._0_4_ = auVar14._0_4_;
      local_a8._4_4_ = auVar14._4_4_;
      local_a8._8_4_ = auVar14._8_4_;
      local_a8._12_4_ = auVar14._12_4_;
      local_b8._0_4_ = auVar15._0_4_;
      local_b8._4_4_ = auVar15._4_4_;
      local_b8._8_8_ = auVar15._8_8_;
    }
    dVar16 = dVar16 + dVar9;
    dVar9 = ((double)local_b8._8_8_ - (double)CONCAT44(local_a8._12_4_,local_a8._8_4_)) *
            ((double)CONCAT44(local_b8._4_4_,local_b8._0_4_) -
            (double)CONCAT44(local_a8._4_4_,local_a8._0_4_));
    if (dVar9 < local_c0) {
      local_68 = (float)(double)CONCAT44(local_a8._4_4_,local_a8._0_4_);
      fStack_64 = (float)(double)CONCAT44(local_a8._12_4_,local_a8._8_4_);
      local_58 = (float)(double)CONCAT44(local_b8._4_4_,local_b8._0_4_);
      fStack_54 = (float)(double)local_b8._8_8_;
      local_c8 = dVar16;
      local_c0 = dVar9;
    }
  }
  v.x = (float)((double)local_58 + psz);
  IVar10.y = (float)((double)fStack_64 - psz);
  IVar10.x = (float)((double)local_68 - psz);
  IVar10 = VHRotateV(IVar10,local_c8);
  __return_storage_ptr__->_M_elems[0] = IVar10;
  v.y = (float)((double)fStack_64 - psz);
  IVar10 = VHRotateV(v,local_c8);
  __return_storage_ptr__->_M_elems[1] = IVar10;
  v_00.y = (float)((double)fStack_54 + psz);
  v_00.x = v.x;
  IVar10 = VHRotateV(v_00,local_c8);
  __return_storage_ptr__->_M_elems[2] = IVar10;
  v_01.y = (float)((double)fStack_54 + psz);
  v_01.x = (float)((double)local_68 - psz);
  IVar10 = VHRotateV(v_01,local_c8);
  __return_storage_ptr__->_M_elems[3] = IVar10;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    IVar11.x = __return_storage_ptr__->_M_elems[lVar2].x + auVar13._0_4_;
    IVar11.y = __return_storage_ptr__->_M_elems[lVar2].y + auVar13._4_4_;
    __return_storage_ptr__->_M_elems[lVar2] = IVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

std::array<ImVec2, 4> VHMBBCalculate(std::vector<ImVec2> hull, double psz) {
	std::array<ImVec2, 4> box;

	double mbAngle = 0, cumulative_angle = 0;
	double mbArea = DBL_MAX; // fake area to initialise
	ImVec2 mbb, mba, origin; // Box bottom left, box top right

	// Find the lowest hull point, if it's below the x-axis just bring it up to
	// compensate
	// NOTE: we're not modifying the actual hull point, just a copy
	origin.x = DBL_MAX;
	origin.y = DBL_MAX;

	// find bottom corner
	for (size_t i = 0; i < hull.size(); i++) {
		if (hull[i].y < origin.y) origin.y = hull[i].y;
		if (hull[i].x < origin.x) origin.x = hull[i].x;
	}

	// transpose
	for (size_t i = 0; i < hull.size(); i++) {
		hull[i].x -= origin.x;
		hull[i].y -= origin.y;
	}

	// rotate hull on each side and work out the smallest area
	for (size_t i = 0; i < hull.size(); i++) {
		int ni = i + 1;
		double area;

		ImVec2 current = hull[i];
		ImVec2 next    = hull[ni % hull.size()];

		double angle = VHAngleToX(current, next); // angle formed between current and next hull points;
		cumulative_angle += angle;

		double top, bot, left, right; // bounding rect limits
		top = right = DBL_MIN;
		bot = left = DBL_MAX;

		for (size_t x = 0; x < hull.size(); x++) {
			ImVec2 rp = VHRotateV(hull[x], -angle);

			hull[x] = rp;

			if (rp.y > top) top     = rp.y;
			if (rp.y < bot) bot     = rp.y;
			if (rp.x > right) right = rp.x;
			if (rp.x < left) left   = rp.x;
		}
		area = (right - left) * (top - bot);

		if (area < mbArea) {
			mbArea  = area;
			mbAngle = cumulative_angle; // total angle we've had to rotate the board
			                            // to get to this orientation;
			mba = ImVec2(left, bot);
			mbb = ImVec2(right, top);
		}
	} // for all points on hull

	// expand by pin size
	mba.x -= psz;
	mba.y -= psz;
	mbb.x += psz;
	mbb.y += psz;

	// Form our rectangle, has to be all 4 points as it's a polygon now that'll be
	// rotated
	box[0] = VHRotateV(mba, +mbAngle);
	box[1] = VHRotateV(ImVec2(mbb.x, mba.y), +mbAngle);
	box[2] = VHRotateV(mbb, +mbAngle);
	box[3] = VHRotateV(ImVec2(mba.x, mbb.y), +mbAngle);

	// Transpose MBB back
	for (size_t i = 0; i < 4; i++) {
		box[i].x += origin.x;
		box[i].y += origin.y;
	}

	return box;
}